

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PropertySpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PropertySpecSyntax,slang::syntax::TimingControlSyntax*,slang::syntax::DisableIffSyntax*,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,TimingControlSyntax **args,DisableIffSyntax **args_1,
          PropertyExprSyntax *args_2)

{
  PropertySpecSyntax *pPVar1;
  PropertyExprSyntax *in_RDX;
  DisableIffSyntax *in_RSI;
  BumpAllocator *in_RDI;
  PropertySpecSyntax *unaff_retaddr;
  
  pPVar1 = (PropertySpecSyntax *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  slang::syntax::PropertySpecSyntax::PropertySpecSyntax
            (unaff_retaddr,(TimingControlSyntax *)in_RDI,in_RSI,in_RDX);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }